

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits,uint32_t page_size)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  Result result;
  MemoryType local_c8;
  uint64_t local_98;
  uint64_t local_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  MemoryType memory_type;
  uint32_t page_size_local;
  Limits *limits_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  GetLocation((Location *)&memory_type.page_size,this);
  result = SharedValidator::OnMemory
                     (&this->validator_,(Location *)&memory_type.page_size,limits,page_size);
  bVar2 = Failed(result);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_98 = limits->initial;
    local_90 = limits->max;
    local_88._0_1_ = limits->has_max;
    local_88._1_1_ = limits->is_shared;
    local_88._2_1_ = limits->is_64;
    local_88._3_5_ = *(undefined5 *)&limits->field_0x13;
    MemoryType::MemoryType((MemoryType *)local_80,*limits,page_size);
    pMVar1 = this->module_;
    MemoryType::MemoryType(&local_c8,(MemoryType *)local_80);
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::push_back
              (&pMVar1->memories,(value_type *)&local_c8);
    MemoryDesc::~MemoryDesc((MemoryDesc *)&local_c8);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)local_80);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    MemoryType::~MemoryType((MemoryType *)local_80);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index,
                                    const Limits* limits,
                                    uint32_t page_size) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *limits, page_size));
  MemoryType memory_type{*limits, page_size};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}